

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

void * xmlCopyEntity(void *payload,xmlChar *name)

{
  void *__s;
  xmlChar *pxVar1;
  
  __s = (*xmlMalloc)(0x88);
  if (__s == (void *)0x0) {
    xmlEntitiesErrMemory("xmlCopyEntity:: malloc failed");
  }
  else {
    memset(__s,0,0x88);
    *(undefined4 *)((long)__s + 8) = 0x11;
    *(undefined4 *)((long)__s + 0x5c) = *(undefined4 *)((long)payload + 0x5c);
    if (*(xmlChar **)((long)payload + 0x10) != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
      *(xmlChar **)((long)__s + 0x10) = pxVar1;
    }
    if (*(xmlChar **)((long)payload + 0x60) != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x60));
      *(xmlChar **)((long)__s + 0x60) = pxVar1;
    }
    if (*(xmlChar **)((long)payload + 0x68) != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
      *(xmlChar **)((long)__s + 0x68) = pxVar1;
    }
    if (*(xmlChar **)((long)payload + 0x50) != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x50));
      *(xmlChar **)((long)__s + 0x50) = pxVar1;
    }
    if (*(xmlChar **)((long)payload + 0x48) != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x48));
      *(xmlChar **)((long)__s + 0x48) = pxVar1;
    }
    if (*(xmlChar **)((long)payload + 0x78) != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x78));
      *(xmlChar **)((long)__s + 0x78) = pxVar1;
    }
  }
  return __s;
}

Assistant:

static void *
xmlCopyEntity(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlEntityPtr ent = (xmlEntityPtr) payload;
    xmlEntityPtr cur;

    cur = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (cur == NULL) {
        xmlEntitiesErrMemory("xmlCopyEntity:: malloc failed");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlEntity));
    cur->type = XML_ENTITY_DECL;

    cur->etype = ent->etype;
    if (ent->name != NULL)
	cur->name = xmlStrdup(ent->name);
    if (ent->ExternalID != NULL)
	cur->ExternalID = xmlStrdup(ent->ExternalID);
    if (ent->SystemID != NULL)
	cur->SystemID = xmlStrdup(ent->SystemID);
    if (ent->content != NULL)
	cur->content = xmlStrdup(ent->content);
    if (ent->orig != NULL)
	cur->orig = xmlStrdup(ent->orig);
    if (ent->URI != NULL)
	cur->URI = xmlStrdup(ent->URI);
    return(cur);
}